

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_scalar_split(void *arg,int iters)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  secp256k1_scalar *psVar5;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *r;
  uint uVar7;
  int iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar17;
  undefined1 auVar16 [16];
  secp256k1_scalar tmp;
  secp256k1_scalar local_50;
  
  psVar5 = (secp256k1_scalar *)(ulong)(uint)iters;
  if (iters < 1) {
    iVar4 = 0;
    psVar6 = (secp256k1_scalar *)arg;
  }
  else {
    iVar4 = 0;
    iVar8 = iters;
    do {
      secp256k1_scalar_split_lambda
                (&local_50,(secp256k1_scalar *)((long)arg + 0x20),(secp256k1_scalar *)arg);
      psVar5 = &local_50;
      psVar6 = (secp256k1_scalar *)arg;
      iVar1 = secp256k1_scalar_add
                        ((secp256k1_scalar *)arg,&local_50,(secp256k1_scalar *)((long)arg + 0x20));
      iVar4 = iVar4 + iVar1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (iVar4 <= iters) {
    return;
  }
  bench_scalar_split_cold_1();
  iVar4 = (int)psVar5;
  uVar2 = (ulong)psVar5 & 0xffffffff;
  if (iVar4 < 1) {
    iVar8 = 0;
    r = psVar6;
  }
  else {
    iVar8 = 0;
    do {
      secp256k1_scalar_inverse(psVar6,psVar6);
      psVar5 = psVar6;
      r = psVar6;
      iVar1 = secp256k1_scalar_add(psVar6,psVar6,psVar6 + 1);
      iVar8 = iVar8 + iVar1;
      uVar7 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  if (iVar4 < iVar8) {
    bench_scalar_inverse_cold_1();
    iVar4 = (int)psVar5;
    uVar2 = (ulong)psVar5 & 0xffffffff;
    if (iVar4 < 1) {
      iVar8 = 0;
      psVar6 = r;
    }
    else {
      iVar8 = 0;
      do {
        secp256k1_scalar_inverse_var(r,r);
        psVar5 = r;
        psVar6 = r;
        iVar1 = secp256k1_scalar_add(r,r,r + 1);
        iVar8 = iVar8 + iVar1;
        uVar7 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar7;
      } while (uVar7 != 0);
    }
    if (iVar4 < iVar8) {
      bench_scalar_inverse_var_cold_1();
      if (0 < (int)psVar5) {
        uVar11 = psVar6[2].d[0];
        uVar12 = psVar6[2].d[1];
        uVar9 = psVar6[2].d[2];
        uVar10 = psVar6[2].d[3];
        uVar2 = psVar6[3].d[0];
        do {
          uVar3 = -(ulong)((uint)uVar11 & 1);
          uVar2 = uVar2 + (uVar3 >> 0x10);
          auVar14._8_4_ = (int)uVar3;
          auVar14._0_8_ = uVar3;
          auVar14._12_4_ = (int)(uVar3 >> 0x20);
          uVar13 = (uVar3 >> 0xc) + uVar9;
          uVar15 = (auVar14._8_8_ >> 0xc) + uVar10;
          uVar17 = (uVar3 >> 0xc) + uVar12;
          auVar16._8_4_ = (int)uVar13;
          auVar16._0_8_ = uVar17;
          auVar16._12_4_ = (int)(uVar13 >> 0x20);
          uVar11 = ((uVar17 & 1) << 0x33) + ((uVar3 >> 0xc & 0xffffefffffc2f) + uVar11 >> 1);
          uVar12 = ((auVar16._8_8_ & 1) << 0x33) + (uVar17 >> 1);
          uVar9 = ((uVar15 & 1) << 0x33) + (uVar13 >> 1);
          uVar10 = ((uVar2 & 1) << 0x33) + (uVar15 >> 1);
          uVar2 = uVar2 >> 1;
          uVar7 = (int)psVar5 - 1;
          psVar5 = (secp256k1_scalar *)(ulong)uVar7;
        } while (uVar7 != 0);
        psVar6[2].d[0] = uVar11;
        psVar6[2].d[1] = uVar12;
        psVar6[2].d[2] = uVar9;
        psVar6[2].d[3] = uVar10;
        psVar6[3].d[0] = uVar2;
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

static void bench_scalar_split(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_scalar tmp;

    for (i = 0; i < iters; i++) {
        secp256k1_scalar_split_lambda(&tmp, &data->scalar[1], &data->scalar[0]);
        j += secp256k1_scalar_add(&data->scalar[0], &tmp, &data->scalar[1]);
    }
    CHECK(j <= iters);
}